

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O0

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
duckdb::OrderModifier::Deserialize(Deserializer *deserializer)

{
  Deserializer *in_RSI;
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_> in_RDI;
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> result;
  pointer pOVar1;
  OrderModifier *in_stack_ffffffffffffffb0;
  vector<duckdb::OrderByNode,_true> *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  field_id_t in_stack_ffffffffffffffee;
  Deserializer *this;
  
  operator_new(0x28);
  OrderModifier(in_stack_ffffffffffffffb0);
  pOVar1 = (pointer)&stack0xffffffffffffffe8;
  unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>::
  unique_ptr<std::default_delete<duckdb::OrderModifier>,void>
            ((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> *)
             in_stack_ffffffffffffffb0,pOVar1);
  this = in_RSI;
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::operator->
            ((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> *)
             in_RSI);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (this,in_stack_ffffffffffffffee,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>::
  unique_ptr<duckdb::OrderModifier,std::default_delete<std::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>>>,void>
            ((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)in_RSI,
             (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_> *)
             pOVar1);
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::~unique_ptr
            ((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> *)
             0xae6ece);
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (__uniq_ptr_impl<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ResultModifier_*,_std::default_delete<duckdb::ResultModifier>_>
         .super__Head_base<0UL,_duckdb::ResultModifier_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ResultModifier> OrderModifier::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<OrderModifier>(new OrderModifier());
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(200, "orders", result->orders);
	return std::move(result);
}